

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

ResetPtr __thiscall libcellml::Annotator::testValue(Annotator *this,string *id,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ResetPtr RVar1;
  Annotator local_20;
  
  item(&local_20,id,index);
  AnyCellmlElement::reset((AnyCellmlElement *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20.super_Logger.mPimpl);
  RVar1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Annotator::testValue(const std::string &id, size_t index)
{
    return item(id, index)->reset();
}